

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-thread-equal.c
# Opt level: O1

int run_test_thread_equal(void)

{
  void **ppvVar1;
  int iVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  int extraout_EAX_04;
  int extraout_EAX_05;
  uv_thread_t uVar3;
  void *pvVar4;
  undefined4 *puVar5;
  pthread_t __th;
  ulong uVar6;
  addrinfo *ai;
  uv_thread_t *unaff_RBX;
  code *pcVar7;
  uv_key_t *tid;
  int iVar8;
  uv_thread_t *puVar9;
  uv_thread_t *puVar10;
  uv_thread_t *puVar11;
  uv_key_t *tid_00;
  code **ppcVar12;
  code **ppcVar13;
  uv_thread_t *puVar14;
  uv_thread_t *puVar15;
  uv_thread_t *puVar16;
  uv_thread_t *puVar17;
  uv_thread_t *puVar18;
  uv_thread_t *puVar19;
  uv_thread_t *puVar20;
  uv_thread_t *puVar21;
  uv_thread_t *puVar22;
  uv_loop_t *puVar23;
  uv_loop_t *loop;
  long lVar24;
  uv_thread_t threads [2];
  uv_thread_t uStack_f28;
  uv_thread_options_t uStack_f20;
  ulong uStack_f10;
  rlimit64 rStack_f08;
  pthread_attr_t pStack_ef8;
  code *pcStack_ec0;
  code *apcStack_eb8 [2];
  code *pcStack_ea8;
  code *pcStack_ea0;
  undefined4 uStack_e90;
  undefined1 uStack_e8c;
  undefined1 auStack_e88 [8];
  undefined1 auStack_e80 [16];
  code *pcStack_e70;
  code *pcStack_e68;
  uv_loop_t uStack_e60;
  getaddrinfo_req agStack_b10 [4];
  fs_req afStack_830 [4];
  code *pcStack_f0;
  long lStack_e8;
  uv_thread_t uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 uStack_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  uv_thread_t *puStack_50;
  uv_thread_t auStack_38 [2];
  uv_thread_t uStack_28;
  code *pcStack_20;
  uv_thread_t uStack_18;
  uv_thread_t local_10;
  uv_fs_t *req;
  
  puVar10 = &uStack_18;
  puVar11 = &uStack_18;
  pcStack_20 = (code *)0x1729ea;
  main_thread_id = uv_thread_self();
  puVar9 = &main_thread_id;
  pcStack_20 = (code *)0x172a00;
  iVar2 = uv_thread_equal(&main_thread_id,&main_thread_id);
  if (iVar2 == 0) {
    pcStack_20 = (code *)0x172a79;
    run_test_thread_equal_cold_6();
LAB_00172a79:
    pcStack_20 = (code *)0x172a7e;
    run_test_thread_equal_cold_1();
LAB_00172a7e:
    puVar11 = puVar9;
    pcStack_20 = (code *)0x172a83;
    run_test_thread_equal_cold_2();
LAB_00172a83:
    pcStack_20 = (code *)0x172a88;
    run_test_thread_equal_cold_3();
LAB_00172a88:
    pcStack_20 = (code *)0x172a8d;
    run_test_thread_equal_cold_4();
  }
  else {
    pcStack_20 = (code *)0x172a1a;
    iVar2 = uv_thread_create(&uStack_18,check_thread,subthreads);
    puVar9 = puVar10;
    if (iVar2 != 0) goto LAB_00172a79;
    unaff_RBX = &local_10;
    pcStack_20 = (code *)0x172a39;
    puVar9 = unaff_RBX;
    iVar2 = uv_thread_create(unaff_RBX,check_thread,subthreads + 1);
    if (iVar2 != 0) goto LAB_00172a7e;
    pcStack_20 = (code *)0x172a45;
    iVar2 = uv_thread_join(&uStack_18);
    if (iVar2 != 0) goto LAB_00172a83;
    pcStack_20 = (code *)0x172a51;
    puVar11 = unaff_RBX;
    iVar2 = uv_thread_join(unaff_RBX);
    if (iVar2 != 0) goto LAB_00172a88;
    puVar11 = subthreads;
    pcStack_20 = (code *)0x172a68;
    iVar2 = uv_thread_equal(subthreads,subthreads + 1);
    if (iVar2 == 0) {
      return 0;
    }
  }
  pcStack_20 = check_thread;
  run_test_thread_equal_cold_5();
  auStack_38[0] = 0x172a9f;
  pcStack_20 = (code *)unaff_RBX;
  uStack_28 = uv_thread_self();
  auStack_38[0] = 0x172ab3;
  iVar2 = uv_thread_equal(&main_thread_id,&uStack_28);
  if (iVar2 == 0) {
    auStack_38[0] = 0x172abc;
    uVar3 = uv_thread_self();
    *puVar11 = uVar3;
    return (int)uVar3;
  }
  auStack_38[0] = 0x172aca;
  check_thread_cold_1();
  puVar10 = auStack_38;
  puVar9 = auStack_38;
  iVar2 = uv_thread_create(auStack_38,thread_entry,(void *)0x2a);
  if (iVar2 == 0) {
    iVar2 = uv_thread_join(auStack_38);
    if (iVar2 != 0) goto LAB_00172b03;
    if (thread_called == 1) {
      return 0;
    }
  }
  else {
    run_test_thread_create_cold_1();
    puVar9 = puVar10;
LAB_00172b03:
    run_test_thread_create_cold_2();
  }
  run_test_thread_create_cold_3();
  if (puVar9 == (uv_thread_t *)0x2a) {
    thread_called = thread_called + 1;
    return extraout_EAX;
  }
  thread_entry_cold_1();
  uStack_68 = 0;
  uStack_60 = 0;
  uStack_78 = 0;
  uStack_70 = 0;
  uStack_88 = 0;
  uStack_80 = 0;
  uStack_98 = 0;
  uStack_90 = 0;
  uStack_a8 = 0;
  uStack_a0 = 0;
  uStack_b8 = 0;
  uStack_b0 = 0;
  uStack_c8 = 0;
  uStack_c0 = 0;
  uStack_d8 = 0;
  uStack_d0 = 0;
  lVar24 = 0;
  pcVar7 = do_work;
  puStack_50 = puVar11;
  do {
    tid = (uv_key_t *)((long)&uStack_d8 + lVar24);
    iVar2 = uv_thread_create((uv_thread_t *)tid,do_work,tid);
    if (iVar2 != 0) {
      run_test_threadpool_multiple_event_loops_cold_1();
      goto LAB_00172bb3;
    }
    lVar24 = lVar24 + 0x10;
  } while (lVar24 != 0x80);
  pcVar7 = (code *)0x0;
  while( true ) {
    tid = (uv_key_t *)((long)&uStack_d8 + (long)pcVar7);
    iVar2 = uv_thread_join((uv_thread_t *)tid);
    if (iVar2 != 0) break;
    if (*(int *)((long)&uStack_d0 + (long)pcVar7) != 1) goto LAB_00172bb3;
    pcVar7 = pcVar7 + 0x10;
    if (pcVar7 == (code *)0x80) {
      return 0;
    }
  }
  goto LAB_00172bb8;
LAB_00172bb3:
  run_test_threadpool_multiple_event_loops_cold_3();
LAB_00172bb8:
  run_test_threadpool_multiple_event_loops_cold_2();
  puVar23 = &uStack_e60;
  pcStack_e68 = (code *)0x172bd7;
  pcStack_f0 = pcVar7;
  lStack_e8 = lVar24;
  iVar2 = uv_loop_init(&uStack_e60);
  if (iVar2 == 0) {
    lVar24 = 0;
    do {
      *(undefined4 *)((long)agStack_b10[0].handle.reserved + lVar24 + -0x20) = 4;
      *(uv_loop_t **)((long)agStack_b10[0].handle.reserved + lVar24 + -0x18) = &uStack_e60;
      pcStack_e68 = (code *)0x172bfd;
      getaddrinfo_do((getaddrinfo_req *)((long)agStack_b10[0].handle.reserved + lVar24 + -0x28));
      lVar24 = lVar24 + 0xb8;
    } while (lVar24 != 0x2e0);
    lVar24 = 0;
    do {
      *(undefined4 *)((long)afStack_830[0].handle.reserved + lVar24 + -0x20) = 4;
      *(uv_loop_t **)((long)afStack_830[0].handle.reserved + lVar24 + -0x18) = &uStack_e60;
      pcStack_e68 = (code *)0x172c2b;
      fs_do((fs_req *)((long)afStack_830[0].handle.reserved + lVar24 + -0x28));
      lVar24 = lVar24 + 0x1d0;
    } while (lVar24 != 0x740);
    pcStack_e68 = (code *)0x172c45;
    iVar2 = uv_run(&uStack_e60,UV_RUN_DEFAULT);
    if (iVar2 != 0) goto LAB_00172c6e;
    pcStack_e68 = (code *)0x172c51;
    iVar2 = uv_loop_close(&uStack_e60);
    if (iVar2 == 0) {
      *(undefined4 *)((long)tid + 8) = 1;
      return 0;
    }
  }
  else {
    pcStack_e68 = (code *)0x172c6e;
    do_work_cold_1();
LAB_00172c6e:
    pcStack_e68 = (code *)0x172c73;
    do_work_cold_2();
  }
  pcStack_e68 = run_test_thread_local_storage;
  do_work_cold_3();
  uStack_e8c = 0;
  uStack_e90 = 0x6e69616d;
  tid_00 = &tls_key;
  pcStack_ea0 = (code *)0x172c98;
  pcStack_e70 = (code *)tid;
  pcStack_e68 = (code *)&uStack_e60;
  iVar2 = uv_key_create(&tls_key);
  if (iVar2 == 0) {
    tid_00 = &tls_key;
    pcStack_ea0 = (code *)0x172cac;
    pvVar4 = uv_key_get(&tls_key);
    if (pvVar4 != (void *)0x0) goto LAB_00172d41;
    tid = &tls_key;
    puVar23 = (uv_loop_t *)&uStack_e90;
    pcStack_ea0 = (code *)0x172ccc;
    uv_key_set(&tls_key,puVar23);
    tid_00 = &tls_key;
    pcStack_ea0 = (code *)0x172cd4;
    puVar5 = (undefined4 *)uv_key_get(&tls_key);
    if (puVar23 != (uv_loop_t *)puVar5) goto LAB_00172d46;
    tid_00 = (uv_key_t *)auStack_e88;
    pcStack_ea0 = (code *)0x172ced;
    iVar2 = uv_thread_create((uv_thread_t *)tid_00,tls_thread,tid_00);
    if (iVar2 != 0) goto LAB_00172d4b;
    tid = (uv_key_t *)auStack_e80;
    pcStack_ea0 = (code *)0x172d08;
    tid_00 = tid;
    iVar2 = uv_thread_create((uv_thread_t *)tid,tls_thread,tid);
    if (iVar2 != 0) goto LAB_00172d50;
    tid_00 = (uv_key_t *)auStack_e88;
    pcStack_ea0 = (code *)0x172d16;
    iVar2 = uv_thread_join((uv_thread_t *)tid_00);
    if (iVar2 != 0) goto LAB_00172d55;
    pcStack_ea0 = (code *)0x172d22;
    tid_00 = tid;
    iVar2 = uv_thread_join((uv_thread_t *)tid);
    if (iVar2 == 0) {
      pcStack_ea0 = (code *)0x172d32;
      uv_key_delete(&tls_key);
      return 0;
    }
  }
  else {
    pcStack_ea0 = (code *)0x172d41;
    run_test_thread_local_storage_cold_1();
LAB_00172d41:
    pcStack_ea0 = (code *)0x172d46;
    run_test_thread_local_storage_cold_2();
LAB_00172d46:
    pcStack_ea0 = (code *)0x172d4b;
    run_test_thread_local_storage_cold_3();
LAB_00172d4b:
    pcStack_ea0 = (code *)0x172d50;
    run_test_thread_local_storage_cold_4();
LAB_00172d50:
    pcStack_ea0 = (code *)0x172d55;
    run_test_thread_local_storage_cold_5();
LAB_00172d55:
    pcStack_ea0 = (code *)0x172d5a;
    run_test_thread_local_storage_cold_6();
  }
  pcStack_ea0 = tls_thread;
  run_test_thread_local_storage_cold_7();
  apcStack_eb8[0] = (code *)0x172d72;
  pcStack_ea8 = (code *)tid;
  pcStack_ea0 = (code *)puVar23;
  pvVar4 = uv_key_get(&tls_key);
  if (pvVar4 == (void *)0x0) {
    apcStack_eb8[0] = (code *)0x172d89;
    uv_key_set(&tls_key,tid_00);
    apcStack_eb8[0] = (code *)0x172d91;
    pcVar7 = (code *)uv_key_get(&tls_key);
    if (pcVar7 != (code *)tid_00) goto LAB_00172dc1;
    tid_00 = &tls_key;
    apcStack_eb8[0] = (code *)0x172da7;
    uv_key_set(&tls_key,(void *)0x0);
    apcStack_eb8[0] = (code *)0x172daf;
    pvVar4 = uv_key_get(&tls_key);
    if (pvVar4 == (void *)0x0) {
      return 0;
    }
  }
  else {
    apcStack_eb8[0] = (code *)0x172dc1;
    tls_thread_cold_1();
LAB_00172dc1:
    apcStack_eb8[0] = (code *)0x172dc6;
    tls_thread_cold_2();
  }
  apcStack_eb8[0] = run_test_thread_stack_size;
  tls_thread_cold_3();
  ppcVar12 = apcStack_eb8;
  ppcVar13 = apcStack_eb8;
  pcStack_ec0 = (code *)0x172ddd;
  iVar2 = uv_thread_create((uv_thread_t *)apcStack_eb8,thread_check_stack,(void *)0x0);
  if (iVar2 == 0) {
    pcStack_ec0 = (code *)0x172de9;
    iVar2 = uv_thread_join((uv_thread_t *)apcStack_eb8);
    ppcVar12 = ppcVar13;
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    pcStack_ec0 = (code *)0x172df6;
    run_test_thread_stack_size_cold_1();
  }
  pcStack_ec0 = thread_check_stack;
  run_test_thread_stack_size_cold_2();
  uStack_f20.stack_size = 0x172e12;
  pcStack_ec0 = (code *)tid_00;
  iVar2 = getrlimit64(RLIMIT_STACK,&rStack_f08);
  if (iVar2 == 0) {
    if (rStack_f08.rlim_cur == 0xffffffffffffffff) {
      rStack_f08.rlim_cur = 0x200000;
    }
    uStack_f20.stack_size = 0x172e2c;
    __th = pthread_self();
    uStack_f20.stack_size = 0x172e39;
    iVar2 = pthread_getattr_np(__th,&pStack_ef8);
    if (iVar2 != 0) goto LAB_00172e84;
    uStack_f20.stack_size = 0x172e4a;
    iVar2 = pthread_attr_getstacksize(&pStack_ef8,&uStack_f10);
    if (iVar2 != 0) goto LAB_00172e89;
    if (ppcVar12 == (code **)0x0) {
      uVar6 = 0;
    }
    else {
      uVar6 = *(ulong *)((long)ppcVar12 + 8);
    }
    if (uVar6 == 0) {
      uVar6 = rStack_f08.rlim_cur;
    }
    if (uStack_f10 < uVar6) goto LAB_00172e8e;
    uStack_f20.stack_size = 0x172e75;
    iVar2 = pthread_attr_destroy(&pStack_ef8);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    uStack_f20.stack_size = 0x172e84;
    thread_check_stack_cold_1();
LAB_00172e84:
    uStack_f20.stack_size = 0x172e89;
    thread_check_stack_cold_2();
LAB_00172e89:
    uStack_f20.stack_size = 0x172e8e;
    thread_check_stack_cold_3();
LAB_00172e8e:
    uStack_f20.stack_size = 0x172e93;
    thread_check_stack_cold_5();
  }
  uStack_f20.stack_size = (size_t)run_test_thread_stack_size_explicit;
  thread_check_stack_cold_4();
  puVar14 = &uStack_f28;
  puVar15 = &uStack_f28;
  puVar16 = &uStack_f28;
  puVar21 = &uStack_f28;
  puVar17 = &uStack_f28;
  puVar10 = &uStack_f28;
  puVar18 = &uStack_f28;
  puVar11 = &uStack_f28;
  puVar19 = &uStack_f28;
  puVar9 = &uStack_f28;
  puVar20 = &uStack_f28;
  puVar22 = &uStack_f28;
  uStack_f20.flags = 1;
  uStack_f20.stack_size = 0x100000;
  iVar2 = uv_thread_create_ex(&uStack_f28,&uStack_f20,thread_check_stack,&uStack_f20);
  if (iVar2 == 0) {
    iVar2 = uv_thread_join(&uStack_f28);
    puVar14 = puVar15;
    if (iVar2 != 0) goto LAB_00173009;
    uStack_f20.stack_size = 0x800000;
    iVar2 = uv_thread_create_ex(&uStack_f28,&uStack_f20,thread_check_stack,&uStack_f20);
    puVar14 = puVar16;
    if (iVar2 != 0) goto LAB_0017300e;
    iVar2 = uv_thread_join(&uStack_f28);
    if (iVar2 != 0) goto LAB_00173013;
    uStack_f20.stack_size = 0;
    iVar2 = uv_thread_create_ex(&uStack_f28,&uStack_f20,thread_check_stack,&uStack_f20);
    puVar21 = puVar17;
    if (iVar2 != 0) goto LAB_00173018;
    iVar2 = uv_thread_join(&uStack_f28);
    if (iVar2 != 0) goto LAB_0017301d;
    lVar24 = __sysconf(0x4b);
    uStack_f20.stack_size = lVar24 - 0x2a;
    iVar2 = uv_thread_create_ex(&uStack_f28,&uStack_f20,thread_check_stack,&uStack_f20);
    puVar10 = puVar18;
    if (iVar2 != 0) goto LAB_00173022;
    iVar2 = uv_thread_join(&uStack_f28);
    if (iVar2 != 0) goto LAB_00173027;
    lVar24 = __sysconf(0x4b);
    uStack_f20.stack_size = lVar24 / 2 - 0x2a;
    iVar2 = uv_thread_create_ex(&uStack_f28,&uStack_f20,thread_check_stack,&uStack_f20);
    puVar11 = puVar19;
    if (iVar2 != 0) goto LAB_0017302c;
    iVar2 = uv_thread_join(&uStack_f28);
    if (iVar2 != 0) goto LAB_00173031;
    uStack_f20.stack_size = 0x12d687;
    iVar2 = uv_thread_create_ex(&uStack_f28,&uStack_f20,thread_check_stack,&uStack_f20);
    puVar9 = puVar20;
    if (iVar2 == 0) {
      iVar2 = uv_thread_join(&uStack_f28);
      if (iVar2 == 0) {
        return 0;
      }
      goto LAB_0017303b;
    }
  }
  else {
    run_test_thread_stack_size_explicit_cold_1();
LAB_00173009:
    run_test_thread_stack_size_explicit_cold_2();
LAB_0017300e:
    puVar21 = puVar14;
    run_test_thread_stack_size_explicit_cold_3();
LAB_00173013:
    run_test_thread_stack_size_explicit_cold_4();
LAB_00173018:
    puVar10 = puVar21;
    run_test_thread_stack_size_explicit_cold_5();
LAB_0017301d:
    run_test_thread_stack_size_explicit_cold_6();
LAB_00173022:
    puVar11 = puVar10;
    run_test_thread_stack_size_explicit_cold_7();
LAB_00173027:
    run_test_thread_stack_size_explicit_cold_8();
LAB_0017302c:
    puVar9 = puVar11;
    run_test_thread_stack_size_explicit_cold_9();
LAB_00173031:
    run_test_thread_stack_size_explicit_cold_10();
  }
  puVar22 = puVar9;
  run_test_thread_stack_size_explicit_cold_11();
LAB_0017303b:
  run_test_thread_stack_size_explicit_cold_12();
  puVar23 = *(uv_loop_t **)((long)puVar22 + 0x10);
  iVar2 = uv_getaddrinfo(puVar23,(uv_getaddrinfo_t *)((long)puVar22 + 0x18),getaddrinfo_cb,
                         "localhost",(char *)0x0,(addrinfo *)0x0);
  if (iVar2 == 0) {
    return extraout_EAX_00;
  }
  getaddrinfo_do_cold_1();
  loop = (uv_loop_t *)puVar23->handle_queue[0];
  req = (uv_fs_t *)(puVar23->handle_queue + 1);
  iVar2 = uv_fs_stat(loop,req,".",fs_cb);
  iVar8 = (int)req;
  if (iVar2 == 0) {
    return extraout_EAX_01;
  }
  fs_do_cold_1();
  if (iVar8 != 0) {
    getaddrinfo_cb_cold_1();
    uv_fs_req_cleanup((uv_fs_t *)loop);
    ppvVar1 = &loop[-1].inotify_watchers;
    *(int *)ppvVar1 = *(int *)ppvVar1 + -1;
    if (*(int *)ppvVar1 != 0) {
      fs_do((fs_req *)&loop[-1].inotify_read_watcher.fd);
      return extraout_EAX_05;
    }
    return extraout_EAX_04;
  }
  uv_freeaddrinfo(ai);
  ppvVar1 = &loop[-1].inotify_watchers;
  *(int *)ppvVar1 = *(int *)ppvVar1 + -1;
  if (*(int *)ppvVar1 != 0) {
    getaddrinfo_do((getaddrinfo_req *)&loop[-1].inotify_read_watcher.fd);
    return extraout_EAX_03;
  }
  return extraout_EAX_02;
}

Assistant:

TEST_IMPL(thread_equal) {
  uv_thread_t threads[2];
  main_thread_id = uv_thread_self();
  ASSERT(0 != uv_thread_equal(&main_thread_id, &main_thread_id));
  ASSERT(0 == uv_thread_create(threads + 0, check_thread, subthreads + 0));
  ASSERT(0 == uv_thread_create(threads + 1, check_thread, subthreads + 1));
  ASSERT(0 == uv_thread_join(threads + 0));
  ASSERT(0 == uv_thread_join(threads + 1));
  ASSERT(0 == uv_thread_equal(subthreads + 0, subthreads + 1));
  return 0;
}